

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O1

int_type __thiscall
nlohmann::json_abi_v3_11_2::detail::input_stream_adapter::get_character(input_stream_adapter *this)

{
  streambuf *psVar1;
  byte *pbVar2;
  uint uVar3;
  
  psVar1 = this->sb;
  pbVar2 = *(byte **)(psVar1 + 0x10);
  if (pbVar2 < *(byte **)(psVar1 + 0x18)) {
    uVar3 = (uint)*pbVar2;
    *(byte **)(psVar1 + 0x10) = pbVar2 + 1;
  }
  else {
    uVar3 = (**(code **)(*(long *)psVar1 + 0x50))();
  }
  if (uVar3 == 0xffffffff) {
    get_character(this);
  }
  return uVar3;
}

Assistant:

std::char_traits<char>::int_type get_character()
    {
        auto res = sb->sbumpc();
        // set eof manually, as we don't use the istream interface.
        if (JSON_HEDLEY_UNLIKELY(res == std::char_traits<char>::eof()))
        {
            is->clear(is->rdstate() | std::ios::eofbit);
        }
        return res;
    }